

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureFormatTests.cpp
# Opt level: O2

int __thiscall
deqp::gles31::Functional::TextureFormatTests::init(TextureFormatTests *this,EVP_PKEY_CTX *ctx)

{
  uint value;
  deUint32 dVar1;
  TestNodeType internalFormat;
  TestContext *pTVar2;
  Context *pCVar3;
  RenderContext *pRVar4;
  ContextInfo *pCVar5;
  _Alloc_hider _Var6;
  TestNode *pTVar7;
  TestNode *node;
  TestNode *node_00;
  TestNode *node_01;
  char *pcVar8;
  TextureCubeArrayFormatCase *pTVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar10;
  TextureBufferFormatCase *pTVar11;
  long lVar12;
  ulong uVar13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  allocator<char> local_b9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  ulong local_98;
  TestNode *local_90;
  string descriptionBase;
  string nameBase;
  
  pTVar7 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar7,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"unsized",
             "Unsized formats");
  tcu::TestNode::addChild((TestNode *)this,pTVar7);
  node = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"sized",
             "Sized formats");
  tcu::TestNode::addChild((TestNode *)this,node);
  node_00 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node_00,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"buffer",
             "Sized formats (Buffer)");
  tcu::TestNode::addChild((TestNode *)this,node_00);
  node_01 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node_01,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"cube_array",
             "Sized formats (2D Array)");
  tcu::TestNode::addChild(node,node_01);
  lVar12 = 0;
  pbVar10 = &local_b8;
  local_90 = node_01;
  while( true ) {
    if (lVar12 == 0x80) break;
    value = *(uint *)((long)&DAT_01e4e3d8 + lVar12);
    dVar1 = *(deUint32 *)((long)&DAT_01e4e3dc + lVar12);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&nameBase,*(char **)((long)&DAT_01e4e3d0 + lVar12),
               (allocator<char> *)&descriptionBase);
    pcVar8 = glu::getTextureFormatName(value);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,pcVar8,&local_b9);
    std::operator+(&local_b8,&local_e0,", ");
    pcVar8 = glu::getTypeName(dVar1);
    std::operator+(&descriptionBase,&local_b8,pcVar8);
    local_98 = (ulong)value;
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_e0);
    pTVar9 = (TextureCubeArrayFormatCase *)operator_new(0xf8);
    pTVar2 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
    pCVar3 = (this->super_TestCaseGroup).m_context;
    pRVar4 = pCVar3->m_renderCtx;
    pCVar5 = pCVar3->m_contextInfo;
    std::operator+(&local_b8,&nameBase,"_cube_array_pot");
    _Var6._M_p = local_b8._M_dataplus._M_p;
    std::operator+(&local_e0,&descriptionBase,", GL_TEXTURE_CUBE_MAP_ARRAY");
    TextureCubeArrayFormatCase::TextureCubeArrayFormatCase
              (pTVar9,pTVar2,pRVar4,pCVar5,_Var6._M_p,local_e0._M_dataplus._M_p,(deUint32)local_98,
               dVar1,0x40,0xc);
    tcu::TestNode::addChild(pTVar7,(TestNode *)pTVar9);
    std::__cxx11::string::~string((string *)&local_e0);
    std::__cxx11::string::~string((string *)&local_b8);
    pTVar9 = (TextureCubeArrayFormatCase *)operator_new(0xf8);
    pTVar2 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
    pCVar3 = (this->super_TestCaseGroup).m_context;
    pRVar4 = pCVar3->m_renderCtx;
    pCVar5 = pCVar3->m_contextInfo;
    std::operator+(&local_b8,&nameBase,"_cube_array_npot");
    _Var6._M_p = local_b8._M_dataplus._M_p;
    std::operator+(&local_e0,&descriptionBase,", GL_TEXTURE_CUBE_MAP_ARRAY");
    TextureCubeArrayFormatCase::TextureCubeArrayFormatCase
              (pTVar9,pTVar2,pRVar4,pCVar5,_Var6._M_p,local_e0._M_dataplus._M_p,(deUint32)local_98,
               dVar1,0x40,0xc);
    tcu::TestNode::addChild(pTVar7,(TestNode *)pTVar9);
    std::__cxx11::string::~string((string *)&local_e0);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&descriptionBase);
    pbVar10 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              std::__cxx11::string::~string((string *)&nameBase);
    lVar12 = lVar12 + 0x10;
  }
  uVar13 = 8;
  while( true ) {
    if (uVar13 == 0x318) break;
    dVar1 = *(deUint32 *)((long)&PTR_anon_var_dwarf_30bcae_01e4e450 + uVar13);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&nameBase,*(char **)(&UNK_01e4e448 + uVar13),
               (allocator<char> *)&descriptionBase);
    pcVar8 = glu::getTextureFormatName(dVar1);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&descriptionBase,pcVar8,(allocator<char> *)&local_b8);
    local_98 = uVar13;
    pTVar9 = (TextureCubeArrayFormatCase *)operator_new(0xf8);
    pTVar2 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
    pCVar3 = (this->super_TestCaseGroup).m_context;
    pRVar4 = pCVar3->m_renderCtx;
    pCVar5 = pCVar3->m_contextInfo;
    std::operator+(&local_b8,&nameBase,"_pot");
    _Var6._M_p = local_b8._M_dataplus._M_p;
    std::operator+(&local_e0,&descriptionBase,", GL_TEXTURE_CUBE_MAP_ARRAY");
    TextureCubeArrayFormatCase::TextureCubeArrayFormatCase
              (pTVar9,pTVar2,pRVar4,pCVar5,_Var6._M_p,local_e0._M_dataplus._M_p,dVar1,0x40,0xc);
    tcu::TestNode::addChild(local_90,(TestNode *)pTVar9);
    std::__cxx11::string::~string((string *)&local_e0);
    std::__cxx11::string::~string((string *)&local_b8);
    pTVar9 = (TextureCubeArrayFormatCase *)operator_new(0xf8);
    pTVar2 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
    pCVar3 = (this->super_TestCaseGroup).m_context;
    pRVar4 = pCVar3->m_renderCtx;
    pCVar5 = pCVar3->m_contextInfo;
    std::operator+(&local_b8,&nameBase,"_npot");
    _Var6._M_p = local_b8._M_dataplus._M_p;
    std::operator+(&local_e0,&descriptionBase,", GL_TEXTURE_CUBE_MAP_ARRAY");
    TextureCubeArrayFormatCase::TextureCubeArrayFormatCase
              (pTVar9,pTVar2,pRVar4,pCVar5,_Var6._M_p,local_e0._M_dataplus._M_p,dVar1,0x40,0xc);
    tcu::TestNode::addChild(local_90,(TestNode *)pTVar9);
    std::__cxx11::string::~string((string *)&local_e0);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&descriptionBase);
    pbVar10 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              std::__cxx11::string::~string((string *)&nameBase);
    uVar13 = local_98 + 0x10;
  }
  uVar13 = 8;
  while( true ) {
    if (uVar13 == 0x58) break;
    dVar1 = *(deUint32 *)((long)&PTR_anon_var_dwarf_18ee1ea_01e4e760 + uVar13);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&nameBase,*(char **)(&UNK_01e4e758 + uVar13),
               (allocator<char> *)&descriptionBase);
    pcVar8 = glu::getTextureFormatName(dVar1);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&descriptionBase,pcVar8,(allocator<char> *)&local_b8);
    local_98 = uVar13;
    pTVar9 = (TextureCubeArrayFormatCase *)operator_new(0xf8);
    pTVar2 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
    pCVar3 = (this->super_TestCaseGroup).m_context;
    pRVar4 = pCVar3->m_renderCtx;
    pCVar5 = pCVar3->m_contextInfo;
    std::operator+(&local_b8,&nameBase,"_pot");
    _Var6._M_p = local_b8._M_dataplus._M_p;
    std::operator+(&local_e0,&descriptionBase,", GL_TEXTURE_CUBE_MAP_ARRAY");
    TextureCubeArrayFormatCase::TextureCubeArrayFormatCase
              (pTVar9,pTVar2,pRVar4,pCVar5,_Var6._M_p,local_e0._M_dataplus._M_p,dVar1,0x40,0xc);
    tcu::TestNode::addChild(local_90,(TestNode *)pTVar9);
    std::__cxx11::string::~string((string *)&local_e0);
    std::__cxx11::string::~string((string *)&local_b8);
    pTVar9 = (TextureCubeArrayFormatCase *)operator_new(0xf8);
    pTVar2 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
    pCVar3 = (this->super_TestCaseGroup).m_context;
    pRVar4 = pCVar3->m_renderCtx;
    pCVar5 = pCVar3->m_contextInfo;
    std::operator+(&local_b8,&nameBase,"_npot");
    _Var6._M_p = local_b8._M_dataplus._M_p;
    std::operator+(&local_e0,&descriptionBase,", GL_TEXTURE_CUBE_MAP_ARRAY");
    TextureCubeArrayFormatCase::TextureCubeArrayFormatCase
              (pTVar9,pTVar2,pRVar4,pCVar5,_Var6._M_p,local_e0._M_dataplus._M_p,dVar1,0x40,0xc);
    tcu::TestNode::addChild(local_90,(TestNode *)pTVar9);
    std::__cxx11::string::~string((string *)&local_e0);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&descriptionBase);
    pbVar10 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              std::__cxx11::string::~string((string *)&nameBase);
    uVar13 = local_98 + 0x10;
  }
  pTVar7 = (TestNode *)0x8;
  while( true ) {
    if (pTVar7 == (TestNode *)0x1b8) break;
    internalFormat = pTVar7[0x4545a].m_nodeType;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&nameBase,*(char **)((long)&pTVar7[0x4545a].m_description.field_2 + 8),
               (allocator<char> *)&descriptionBase);
    pcVar8 = glu::getTextureFormatName(internalFormat);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&descriptionBase,pcVar8,(allocator<char> *)&local_b8);
    local_90 = pTVar7;
    pTVar11 = (TextureBufferFormatCase *)operator_new(0xf0);
    pCVar3 = (this->super_TestCaseGroup).m_context;
    pRVar4 = pCVar3->m_renderCtx;
    std::operator+(&local_b8,&nameBase,"_pot");
    _Var6._M_p = local_b8._M_dataplus._M_p;
    std::operator+(&local_e0,&descriptionBase,", GL_TEXTURE_BUFFER");
    TextureBufferFormatCase::TextureBufferFormatCase
              (pTVar11,pCVar3,pRVar4,_Var6._M_p,local_e0._M_dataplus._M_p,internalFormat,0x40);
    tcu::TestNode::addChild(node_00,(TestNode *)pTVar11);
    std::__cxx11::string::~string((string *)&local_e0);
    std::__cxx11::string::~string((string *)&local_b8);
    pTVar11 = (TextureBufferFormatCase *)operator_new(0xf0);
    pCVar3 = (this->super_TestCaseGroup).m_context;
    pRVar4 = pCVar3->m_renderCtx;
    std::operator+(&local_b8,&nameBase,"_npot");
    _Var6._M_p = local_b8._M_dataplus._M_p;
    std::operator+(&local_e0,&descriptionBase,", GL_TEXTURE_BUFFER");
    TextureBufferFormatCase::TextureBufferFormatCase
              (pTVar11,pCVar3,pRVar4,_Var6._M_p,local_e0._M_dataplus._M_p,internalFormat,0x70);
    tcu::TestNode::addChild(node_00,(TestNode *)pTVar11);
    std::__cxx11::string::~string((string *)&local_e0);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&descriptionBase);
    pbVar10 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              std::__cxx11::string::~string((string *)&nameBase);
    pTVar7 = (TestNode *)&local_90->m_name;
  }
  return (int)pbVar10;
}

Assistant:

void TextureFormatTests::init (void)
{
	tcu::TestCaseGroup* unsizedGroup	= DE_NULL;
	tcu::TestCaseGroup*	sizedGroup		= DE_NULL;
	tcu::TestCaseGroup*	sizedBufferGroup = DE_NULL;
	addChild((unsizedGroup		= new tcu::TestCaseGroup(m_testCtx,	"unsized",	"Unsized formats")));
	addChild((sizedGroup		= new tcu::TestCaseGroup(m_testCtx,	"sized",	"Sized formats")));
	addChild((sizedBufferGroup	= new tcu::TestCaseGroup(m_testCtx,	"buffer",	"Sized formats (Buffer)")));

	tcu::TestCaseGroup*	sizedCubeArrayGroup	= DE_NULL;
	sizedGroup->addChild((sizedCubeArrayGroup = new tcu::TestCaseGroup(m_testCtx, "cube_array", "Sized formats (2D Array)")));

	struct
	{
		const char*	name;
		deUint32	format;
		deUint32	dataType;
	} texFormats[] =
	{
		{ "alpha",							GL_ALPHA,			GL_UNSIGNED_BYTE },
		{ "luminance",						GL_LUMINANCE,		GL_UNSIGNED_BYTE },
		{ "luminance_alpha",				GL_LUMINANCE_ALPHA,	GL_UNSIGNED_BYTE },
		{ "rgb_unsigned_short_5_6_5",		GL_RGB,				GL_UNSIGNED_SHORT_5_6_5 },
		{ "rgb_unsigned_byte",				GL_RGB,				GL_UNSIGNED_BYTE },
		{ "rgba_unsigned_short_4_4_4_4",	GL_RGBA,			GL_UNSIGNED_SHORT_4_4_4_4 },
		{ "rgba_unsigned_short_5_5_5_1",	GL_RGBA,			GL_UNSIGNED_SHORT_5_5_5_1 },
		{ "rgba_unsigned_byte",				GL_RGBA,			GL_UNSIGNED_BYTE }
	};

	for (int formatNdx = 0; formatNdx < DE_LENGTH_OF_ARRAY(texFormats); formatNdx++)
	{
		deUint32	format		= texFormats[formatNdx].format;
		deUint32	dataType	= texFormats[formatNdx].dataType;
		string	nameBase		= texFormats[formatNdx].name;
		string	descriptionBase	= string(glu::getTextureFormatName(format)) + ", " + glu::getTypeName(dataType);

		unsizedGroup->addChild(new TextureCubeArrayFormatCase (m_testCtx, m_context.getRenderContext(), m_context.getContextInfo(), (nameBase + "_cube_array_pot").c_str(),		(descriptionBase + ", GL_TEXTURE_CUBE_MAP_ARRAY").c_str(), format, dataType, 64, 12));
		unsizedGroup->addChild(new TextureCubeArrayFormatCase (m_testCtx, m_context.getRenderContext(), m_context.getContextInfo(), (nameBase + "_cube_array_npot").c_str(),	(descriptionBase + ", GL_TEXTURE_CUBE_MAP_ARRAY").c_str(), format, dataType, 64, 12));
	}

	struct
	{
		const char*	name;
		deUint32	internalFormat;
	} sizedColorFormats[] =
	{
		{ "rgba32f",			GL_RGBA32F,			},
		{ "rgba32i",			GL_RGBA32I,			},
		{ "rgba32ui",			GL_RGBA32UI,		},
		{ "rgba16f",			GL_RGBA16F,			},
		{ "rgba16i",			GL_RGBA16I,			},
		{ "rgba16ui",			GL_RGBA16UI,		},
		{ "rgba8",				GL_RGBA8,			},
		{ "rgba8i",				GL_RGBA8I,			},
		{ "rgba8ui",			GL_RGBA8UI,			},
		{ "srgb8_alpha8",		GL_SRGB8_ALPHA8,	},
		{ "rgb10_a2",			GL_RGB10_A2,		},
		{ "rgb10_a2ui",			GL_RGB10_A2UI,		},
		{ "rgba4",				GL_RGBA4,			},
		{ "rgb5_a1",			GL_RGB5_A1,			},
		{ "rgba8_snorm",		GL_RGBA8_SNORM,		},
		{ "rgb8",				GL_RGB8,			},
		{ "rgb565",				GL_RGB565,			},
		{ "r11f_g11f_b10f",		GL_R11F_G11F_B10F,	},
		{ "rgb32f",				GL_RGB32F,			},
		{ "rgb32i",				GL_RGB32I,			},
		{ "rgb32ui",			GL_RGB32UI,			},
		{ "rgb16f",				GL_RGB16F,			},
		{ "rgb16i",				GL_RGB16I,			},
		{ "rgb16ui",			GL_RGB16UI,			},
		{ "rgb8_snorm",			GL_RGB8_SNORM,		},
		{ "rgb8i",				GL_RGB8I,			},
		{ "rgb8ui",				GL_RGB8UI,			},
		{ "srgb8",				GL_SRGB8,			},
		{ "rgb9_e5",			GL_RGB9_E5,			},
		{ "rg32f",				GL_RG32F,			},
		{ "rg32i",				GL_RG32I,			},
		{ "rg32ui",				GL_RG32UI,			},
		{ "rg16f",				GL_RG16F,			},
		{ "rg16i",				GL_RG16I,			},
		{ "rg16ui",				GL_RG16UI,			},
		{ "rg8",				GL_RG8,				},
		{ "rg8i",				GL_RG8I,			},
		{ "rg8ui",				GL_RG8UI,			},
		{ "rg8_snorm",			GL_RG8_SNORM,		},
		{ "r32f",				GL_R32F,			},
		{ "r32i",				GL_R32I,			},
		{ "r32ui",				GL_R32UI,			},
		{ "r16f",				GL_R16F,			},
		{ "r16i",				GL_R16I,			},
		{ "r16ui",				GL_R16UI,			},
		{ "r8",					GL_R8,				},
		{ "r8i",				GL_R8I,				},
		{ "r8ui",				GL_R8UI,			},
		{ "r8_snorm",			GL_R8_SNORM,		}
	};

	struct
	{
		const char*	name;
		deUint32	internalFormat;
	} sizedDepthStencilFormats[] =
	{
		// Depth and stencil formats
		{ "depth_component32f",	GL_DEPTH_COMPONENT32F	},
		{ "depth_component24",	GL_DEPTH_COMPONENT24	},
		{ "depth_component16",	GL_DEPTH_COMPONENT16	},
		{ "depth32f_stencil8",	GL_DEPTH32F_STENCIL8	},
		{ "depth24_stencil8",	GL_DEPTH24_STENCIL8		}
	};

	for (int formatNdx = 0; formatNdx < DE_LENGTH_OF_ARRAY(sizedColorFormats); formatNdx++)
	{
		deUint32	internalFormat	= sizedColorFormats[formatNdx].internalFormat;
		string		nameBase		= sizedColorFormats[formatNdx].name;
		string		descriptionBase	= glu::getTextureFormatName(internalFormat);

		sizedCubeArrayGroup->addChild(new TextureCubeArrayFormatCase (m_testCtx, m_context.getRenderContext(), m_context.getContextInfo(), (nameBase + "_pot").c_str(),		(descriptionBase + ", GL_TEXTURE_CUBE_MAP_ARRAY").c_str(), internalFormat, 64, 12));
		sizedCubeArrayGroup->addChild(new TextureCubeArrayFormatCase (m_testCtx, m_context.getRenderContext(), m_context.getContextInfo(), (nameBase + "_npot").c_str(),	(descriptionBase + ", GL_TEXTURE_CUBE_MAP_ARRAY").c_str(), internalFormat, 64, 12));
	}

	for (int formatNdx = 0; formatNdx < DE_LENGTH_OF_ARRAY(sizedDepthStencilFormats); formatNdx++)
	{
		deUint32	internalFormat	= sizedDepthStencilFormats[formatNdx].internalFormat;
		string		nameBase		= sizedDepthStencilFormats[formatNdx].name;
		string		descriptionBase	= glu::getTextureFormatName(internalFormat);

		sizedCubeArrayGroup->addChild(new TextureCubeArrayFormatCase (m_testCtx, m_context.getRenderContext(), m_context.getContextInfo(), (nameBase + "_pot").c_str(),		(descriptionBase + ", GL_TEXTURE_CUBE_MAP_ARRAY").c_str(), internalFormat, 64, 12));
		sizedCubeArrayGroup->addChild(new TextureCubeArrayFormatCase (m_testCtx, m_context.getRenderContext(), m_context.getContextInfo(), (nameBase + "_npot").c_str(),	(descriptionBase + ", GL_TEXTURE_CUBE_MAP_ARRAY").c_str(), internalFormat, 64, 12));
	}

	// \todo Check
	struct
	{
		const char*	name;
		deUint32	internalFormat;
	} bufferColorFormats[] =
	{
		{ "r8",					GL_R8,				},
		{ "r16f",				GL_R16F,			},
		{ "r32f",				GL_R32F,			},
		{ "r8i",				GL_R8I,				},
		{ "r16i",				GL_R16I,			},
		{ "r32i",				GL_R32I,			},
		{ "r8ui",				GL_R8UI,			},
		{ "r16ui",				GL_R16UI,			},
		{ "r32ui",				GL_R32UI,			},
		{ "rg8",				GL_RG8,				},
		{ "rg16f",				GL_RG16F,			},
		{ "rg32f",				GL_RG32F,			},
		{ "rg8i",				GL_RG8I,			},
		{ "rg16i",				GL_RG16I,			},
		{ "rg32i",				GL_RG32I,			},
		{ "rg8ui",				GL_RG8UI,			},
		{ "rg16ui",				GL_RG16UI,			},
		{ "rg32ui",				GL_RG32UI,			},
		{ "rgba8",				GL_RGBA8,			},
		{ "rgba16f",			GL_RGBA16F,			},
		{ "rgba32f",			GL_RGBA32F,			},
		{ "rgba8i",				GL_RGBA8I,			},
		{ "rgba16i",			GL_RGBA16I,			},
		{ "rgba32i",			GL_RGBA32I,			},
		{ "rgba8ui",			GL_RGBA8UI,			},
		{ "rgba16ui",			GL_RGBA16UI,		},
		{ "rgba32ui",			GL_RGBA32UI,		}
	};

	for (int formatNdx = 0; formatNdx < DE_LENGTH_OF_ARRAY(bufferColorFormats); formatNdx++)
	{
		deUint32	internalFormat	= bufferColorFormats[formatNdx].internalFormat;
		string		nameBase		= bufferColorFormats[formatNdx].name;
		string		descriptionBase	= glu::getTextureFormatName(internalFormat);

		sizedBufferGroup->addChild	(new TextureBufferFormatCase	(m_context, m_context.getRenderContext(),	(nameBase + "_pot").c_str(),	(descriptionBase + ", GL_TEXTURE_BUFFER").c_str(),	internalFormat, 64));
		sizedBufferGroup->addChild	(new TextureBufferFormatCase	(m_context, m_context.getRenderContext(),	(nameBase + "_npot").c_str(),	(descriptionBase + ", GL_TEXTURE_BUFFER").c_str(),	internalFormat, 112));
	}
}